

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::selectConstant
          (CodegenVisitor *this,SQInteger target,SQObject *constant)

{
  SQObjectType SVar1;
  SQInteger arg1;
  SQOpcode _op;
  SQFuncState *this_00;
  
  SVar1 = constant->_type;
  if (SVar1 == OT_BOOL) {
    this_00 = this->_fs;
    arg1 = (constant->_unVal).nInteger;
    _op = _OP_LOADBOOL;
  }
  else {
    if (SVar1 == OT_FLOAT) {
      EmitLoadConstFloat(this,(constant->_unVal).fFloat,target);
      return;
    }
    if (SVar1 == OT_INTEGER) {
      EmitLoadConstInt(this,(constant->_unVal).nInteger,target);
      return;
    }
    this_00 = this->_fs;
    arg1 = SQFuncState::GetConstant(this_00,constant,0x7fffffff);
    _op = _OP_LOAD;
  }
  SQFuncState::AddInstruction(this_00,_op,target,arg1,0,0);
  return;
}

Assistant:

void CodegenVisitor::selectConstant(SQInteger target, const SQObject &constant) {
    SQObjectType ctype = sq_type(constant);
    switch (ctype) {
    case OT_INTEGER: EmitLoadConstInt(_integer(constant), target); break;
    case OT_FLOAT: EmitLoadConstFloat(_float(constant), target); break;
    case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, target, _integer(constant)); break;
    default: _fs->AddInstruction(_OP_LOAD, target, _fs->GetConstant(constant)); break;
    }
}